

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprintf.c
# Opt level: O0

char * curl_maprintf(char *format,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_118 [8];
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  char *local_60;
  asprintf info;
  undefined1 local_38 [4];
  int retcode;
  va_list ap_save;
  char *format_local;
  
  if (in_AL != '\0') {
    local_e8 = in_XMM0_Qa;
    local_d8 = in_XMM1_Qa;
    local_c8 = in_XMM2_Qa;
    local_b8 = in_XMM3_Qa;
    local_a8 = in_XMM4_Qa;
    local_98 = in_XMM5_Qa;
    local_88 = in_XMM6_Qa;
    local_78 = in_XMM7_Qa;
  }
  local_60 = (char *)0x0;
  info.buffer = (char *)0x0;
  info.len = 0;
  info.alloc._0_4_ = 0;
  ap_save[0].overflow_arg_area = local_118;
  ap_save[0]._0_8_ = &stack0x00000008;
  retcode = 0x30;
  local_38 = (undefined1  [4])0x8;
  local_110 = in_RSI;
  local_108 = in_RDX;
  local_100 = in_RCX;
  local_f8 = in_R8;
  local_f0 = in_R9;
  info._28_4_ = dprintf_formatf(&local_60,alloc_addbyter,format,(__va_list_tag *)local_38);
  if ((info._28_4_ == -1) || ((int)info.alloc != 0)) {
    if (info.len != 0) {
      (*Curl_cfree)(local_60);
    }
    format_local = (char *)0x0;
  }
  else if (info.len == 0) {
    format_local = (*Curl_cstrdup)("");
  }
  else {
    local_60[(long)info.buffer] = '\0';
    format_local = local_60;
  }
  return format_local;
}

Assistant:

char *curl_maprintf(const char *format, ...)
{
  va_list ap_save; /* argument pointer */
  int retcode;
  struct asprintf info;

  info.buffer = NULL;
  info.len = 0;
  info.alloc = 0;
  info.fail = 0;

  va_start(ap_save, format);
  retcode = dprintf_formatf(&info, alloc_addbyter, format, ap_save);
  va_end(ap_save);
  if((-1 == retcode) || info.fail) {
    if(info.alloc)
      free(info.buffer);
    return NULL;
  }
  if(info.alloc) {
    info.buffer[info.len] = 0; /* we terminate this with a zero byte */
    return info.buffer;
  }
  else
    return strdup("");
}